

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logistic_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::logistic_dist<float>::operator()(logistic_dist<float> *this,lcg64_shift *r)

{
  float x;
  result_type_conflict1 rVar1;
  
  x = utility::u01xx_traits<float,_1UL,_trng::lcg64_shift>::oo(r);
  rVar1 = icdf_(this,x);
  return rVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf_(utility::uniformoo<result_type>(r));
    }